

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CameraInfo.h
# Opt level: O2

void __thiscall ViconCGStream::VCameraInfo::Write(VCameraInfo *this,VBuffer *i_rBuffer)

{
  ViconCGStreamIO::VBufferImpl::WritePod<unsigned_int>(&i_rBuffer->m_BufferImpl,&this->m_CameraID);
  ViconCGStreamIO::VBufferImpl::WritePod<unsigned_long_long>
            (&i_rBuffer->m_BufferImpl,&this->m_FramePeriod);
  ViconCGStreamIO::VBufferDetail<0>::Write(&i_rBuffer->m_BufferImpl,&this->m_Type);
  ViconCGStreamIO::VBufferDetail<0>::Write(&i_rBuffer->m_BufferImpl,&this->m_DisplayType);
  ViconCGStreamIO::VBufferDetail<0>::Write(&i_rBuffer->m_BufferImpl,&this->m_Name);
  ViconCGStreamIO::VBufferImpl::WritePod<unsigned_int>
            (&i_rBuffer->m_BufferImpl,&this->m_ResolutionX);
  ViconCGStreamIO::VBufferImpl::WritePod<unsigned_int>
            (&i_rBuffer->m_BufferImpl,&this->m_ResolutionY);
  ViconCGStreamIO::VBufferImpl::WritePod<double>(&i_rBuffer->m_BufferImpl,&this->m_AspectRatio);
  ViconCGStreamIO::VBufferImpl::WritePod<double>
            (&i_rBuffer->m_BufferImpl,&this->m_CircularityThreshold);
  ViconCGStreamIO::VBufferImpl::WritePod<bool>(&i_rBuffer->m_BufferImpl,&this->m_bCentroidTracking);
  ViconCGStreamIO::VBufferImpl::WritePod<bool>(&i_rBuffer->m_BufferImpl,&this->m_bIsVideoCamera);
  ViconCGStreamIO::VBufferImpl::WritePod<unsigned_int>(&i_rBuffer->m_BufferImpl,&this->m_UserID);
  ViconCGStreamIO::VBufferImpl::WritePod<double>(&i_rBuffer->m_BufferImpl,&this->m_MarkerVelocity);
  return;
}

Assistant:

virtual void Write( ViconCGStreamIO::VBuffer & i_rBuffer ) const
  {
    i_rBuffer.Write( m_CameraID );
    i_rBuffer.Write( m_FramePeriod );
    i_rBuffer.Write( m_Type );
    i_rBuffer.Write( m_DisplayType );
    i_rBuffer.Write( m_Name );
    i_rBuffer.Write( m_ResolutionX );
    i_rBuffer.Write( m_ResolutionY );
    i_rBuffer.Write( m_AspectRatio );
    i_rBuffer.Write( m_CircularityThreshold );
    i_rBuffer.Write( m_bCentroidTracking );
    i_rBuffer.Write( m_bIsVideoCamera );
    i_rBuffer.Write( m_UserID );
    i_rBuffer.Write( m_MarkerVelocity );
  }